

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.cpp
# Opt level: O2

int __thiscall ZukerAlgorithm::calculate_W(ZukerAlgorithm *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int j;
  long lVar11;
  int iVar12;
  long lVar13;
  
  calculate_V(this);
  lVar13 = 4;
  for (lVar11 = 1; lVar11 < this->n; lVar11 = lVar11 + 1) {
    piVar6 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = basepair(*piVar6,piVar6[lVar11]);
    piVar2 = (this->V).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (bVar4) {
      piVar6 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar8 = AU[*piVar6][piVar6[lVar11]] + piVar2[lVar11];
      bVar4 = iVar8 < 10000000;
      if (9999999 < iVar8) {
        iVar8 = 10000000;
      }
      iVar5 = -(uint)bVar4;
    }
    else {
      iVar5 = 0;
      iVar8 = 10000000;
    }
    piVar3 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar1 = piVar3[lVar11 + -1];
    iVar7 = iVar8;
    if (iVar1 < iVar8) {
      iVar7 = iVar1;
    }
    piVar6 = (int *)((long)piVar2 + lVar13 + (long)this->n * 4);
    iVar9 = iVar7;
    for (lVar10 = 1; lVar10 <= lVar11 + -4; lVar10 = lVar10 + 1) {
      piVar2 = (this->seq->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = *piVar6 + piVar3[lVar10 + -1] + AU[piVar2[lVar10]][piVar2[lVar11]];
      if (iVar12 < iVar9) {
        iVar9 = iVar12;
      }
      piVar6 = piVar6 + this->n;
    }
    if (iVar1 < iVar8) {
      iVar5 = -2;
    }
    if (iVar9 < iVar7) {
      iVar5 = -4;
    }
    piVar3[lVar11] = iVar9;
    (this->WB).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar11] = iVar5;
    lVar13 = lVar13 + 4;
  }
  return (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[(long)this->n + -1];
}

Assistant:

int ZukerAlgorithm::calculate_W() {
    int min_w = inf, energy = inf, t = 0;

    calculate_V();
    int i = 0;
    for (int j = 1; j < n; ++j) {
        min_w = inf, energy = inf, t = 0;
        if (basepair(seq[i],seq[j])) {
            min_w = min(min_w, V[index(i,j)] + AU[seq[i]][seq[j]]);
            if (energy > min_w) {
                energy = min_w;
                t = -1;
            }
        }
//        de << 1 << " " << min_w << endl;

        min_w = min(min_w, W[index(i,j-1)]);
        if (energy > min_w) {
            energy = min_w;
            t = -2;
        }
//        de << 2 << " " << min_w << endl;

        for (int k = 1; k <= j-4; ++k) {
            min_w = min(min_w, W[index(i,k-1)] + V[index(k,j)] + AU[seq[k]][seq[j]]);
        }
        if (energy > min_w) {
            energy = min_w;
            t = -4;
        }
//        de << 3 << " " << min_w << endl;

        W[index(i,j)] = min_w;
        WB[index(i,j)] = t;
//        de << "Z - l: " << i << ",r: " << j << ",L: " << seq[i] << ",R: " << seq[j] << ",ret: " << min_w  << endl;
    }


    return W[index(0,n-1)];
}